

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RawMsg.h
# Opt level: O2

string * __thiscall
SocketPP::RawMsg::toString_abi_cxx11_(string *__return_storage_ptr__,RawMsg *this)

{
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,(char *)this->data_,&local_39);
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_38,0,this->len_);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const {
        return std::string((char*) data_, 0, len_);
    }